

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::property_name_and_value::property_name_and_value
          (property_name_and_value *this,property_assignment_type type,expression_ptr *name,
          expression_ptr *value)

{
  bool bVar1;
  int iVar2;
  type e;
  pointer peVar3;
  bool local_35;
  expression_ptr *value_local;
  expression_ptr *name_local;
  property_assignment_type type_local;
  property_name_and_value *this_local;
  
  this->type_ = type;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->name_,name);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->value_,value);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->name_);
  local_35 = false;
  if (bVar1) {
    local_35 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->value_);
  }
  if (local_35 == false) {
    __assert_fail("name_ && value_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x105,
                  "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
                 );
  }
  e = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                (&this->name_);
  bVar1 = is_valid_property_name_expression(e);
  if (!bVar1) {
    __assert_fail("is_valid_property_name_expression(*name_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x106,
                  "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
                 );
  }
  bVar1 = true;
  if (type != normal) {
    peVar3 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator->
                       (&this->value_);
    iVar2 = (*(peVar3->super_syntax_node)._vptr_syntax_node[3])();
    bVar1 = iVar2 == 0xb;
  }
  if (bVar1) {
    return;
  }
  __assert_fail("type == property_assignment_type::normal || value_->type() == expression_type::function"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x107,
                "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
               );
}

Assistant:

explicit property_name_and_value(property_assignment_type type, expression_ptr&& name, expression_ptr&& value)
        : type_{type}
        , name_{std::move(name)}
        , value_{std::move(value)} {
        assert(name_ && value_);
        assert(is_valid_property_name_expression(*name_));
        assert(type == property_assignment_type::normal || value_->type() == expression_type::function);
    }